

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<double> expected)

{
  uint uVar1;
  ulong uVar2;
  Fault f;
  ListElementCount local_34;
  ulong local_30;
  
  local_30 = expected._M_len;
  if (reader.builder.elementCount == local_30) {
    for (uVar1 = 0; uVar2 = (ulong)uVar1, uVar2 < local_30; uVar1 = uVar1 + 1) {
      checkElement<double>
                (expected._M_array[uVar2],
                 *(double *)(reader.builder.ptr + (uVar2 * reader.builder.step >> 3)));
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_30,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}